

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

EnumValueDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRepeatedEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int number;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  int *piVar5;
  EnumDescriptor *pEVar6;
  LogMessage *pLVar7;
  string *psVar8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  EnumValueDescriptor *local_30;
  EnumValueDescriptor *result;
  int value;
  int index_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  result._4_4_ = index;
  _value = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,_value,"GetRepeatedEnum","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(_value);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,_value,"GetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(_value);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,_value,"GetRepeatedEnum",CPPTYPE_ENUM);
  }
  bVar1 = FieldDescriptor::is_extension(_value);
  if (bVar1) {
    this_00 = GetExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(_value);
    result._0_4_ = ExtensionSet::GetRepeatedEnum(this_00,number,result._4_4_);
  }
  else {
    piVar5 = GetRepeatedField<int>(this,(Message *)field_local,_value,result._4_4_);
    result._0_4_ = *piVar5;
  }
  pEVar6 = FieldDescriptor::enum_type(_value);
  local_30 = EnumDescriptor::FindValueByNumber(pEVar6,(int)result);
  local_69 = 0;
  if (local_30 == (EnumValueDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x3ad);
    local_69 = 1;
    pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: result != NULL: ");
    pLVar7 = LogMessage::operator<<(pLVar7,"Value ");
    pLVar7 = LogMessage::operator<<(pLVar7,(int)result);
    pLVar7 = LogMessage::operator<<(pLVar7," is not valid for field ");
    psVar8 = FieldDescriptor::full_name_abi_cxx11_(_value);
    pLVar7 = LogMessage::operator<<(pLVar7,psVar8);
    pLVar7 = LogMessage::operator<<(pLVar7," of type ");
    pEVar6 = FieldDescriptor::enum_type(_value);
    psVar8 = EnumDescriptor::full_name_abi_cxx11_(pEVar6);
    pLVar7 = LogMessage::operator<<(pLVar7,psVar8);
    pLVar7 = LogMessage::operator<<(pLVar7,".");
    LogFinisher::operator=(local_7d,pLVar7);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  return local_30;
}

Assistant:

const EnumValueDescriptor* GeneratedMessageReflection::GetRepeatedEnum(
    const Message& message, const FieldDescriptor* field, int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnum, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  const EnumValueDescriptor* result =
    field->enum_type()->FindValueByNumber(value);
  GOOGLE_CHECK(result != NULL) << "Value " << value << " is not valid for field "
                        << field->full_name() << " of type "
                        << field->enum_type()->full_name() << ".";
  return result;
}